

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O1

bool __thiscall soplex::SPxAutoPR<double>::setActivePricer(SPxAutoPR<double> *this,Type type)

{
  SPxPricer<double> *pSVar1;
  
  pSVar1 = &(this->devex).super_SPxPricer<double>;
  if ((this->activepricer == pSVar1) &&
     (this->switchIters <=
      (((this->super_SPxPricer<double>).thesolver)->super_SPxBasisBase<double>).iterCount)) {
    pSVar1 = (SPxPricer<double> *)&this->steep;
  }
  else if ((this->activepricer != (SPxPricer<double> *)&this->steep) ||
          (this->switchIters <=
           (((this->super_SPxPricer<double>).thesolver)->super_SPxBasisBase<double>).iterCount)) {
    return false;
  }
  this->activepricer = pSVar1;
  (*(((SPxSteepPR<double> *)&pSVar1->_vptr_SPxPricer)->super_SPxPricer<double>)._vptr_SPxPricer[7])
            (pSVar1);
  return true;
}

Assistant:

bool SPxAutoPR<R>::setActivePricer(typename SPxSolverBase<R>::Type type)
{
   // switch to steep as soon as switchIters is reached
   if(activepricer == &devex && this->thesolver->iterations() >= switchIters)
   {
      activepricer = &steep;
      activepricer->setType(type);
      return true;
   }


   // use devex for the iterations < switchIters
   else if(activepricer == &steep && this->thesolver->iterations() < switchIters)
   {
      activepricer = &devex;
      activepricer->setType(type);
      return true;
   }

   return false;
}